

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 04_signalfd_epoll.c
# Opt level: O2

void copy_fd(int in,int out)

{
  ssize_t sVar1;
  size_t __n;
  char buff [1024];
  
  memset(buff,0,0x400);
  sVar1 = read(in,buff,0x3ff);
  if ((int)sVar1 != 0) {
    if ((int)sVar1 == -1) {
      perror("read");
      exit(1);
    }
    __n = strlen(buff);
    write(out,buff,__n);
  }
  return;
}

Assistant:

void copy_fd(int in, int out) {
    char buff[1024];
    int bytes_read;

    bzero(buff, sizeof(buff));
    bytes_read = read(in, buff, sizeof(buff)-1 );
    if (bytes_read == -1)
        handle_error("read");
    else if (bytes_read == 0)
        return;
    write(out, buff, strlen(buff));
}